

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppProfile(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  int v;
  int nVars_local;
  Vec_Wec_t *pD_local;
  Vec_Wec_t *pS_local;
  
  for (local_20 = 0; (int)local_20 < nVars; local_20 = local_20 + 1) {
    uVar1 = Vec_WecLevelSize(pS,local_20);
    uVar2 = Vec_WecLevelSize(pD,local_20);
    printf("%2d : S = %3d  D = %3d\n",(ulong)local_20,(ulong)uVar1,(ulong)uVar2);
  }
  return;
}

Assistant:

void Abc_SuppProfile( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        printf( "%2d : S = %3d  D = %3d\n", v, Vec_WecLevelSize(pS, v), Vec_WecLevelSize(pD, v) );
}